

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O3

void pybind11::class_<kratos::Sequence,_std::shared_ptr<kratos::Sequence>_>::init_instance
               (instance *inst,void *holder_ptr)

{
  byte *pbVar1;
  PyTypeObject *valueptr;
  byte bVar2;
  type_info *find_type;
  internals *piVar3;
  instance *local_60;
  undefined1 local_58 [8];
  value_and_holder v_h;
  
  v_h.vh = &kratos::Sequence::typeinfo;
  find_type = detail::get_type_info((type_index *)&v_h.vh,false);
  detail::instance::get_value_and_holder((value_and_holder *)local_58,inst,find_type,true);
  if ((*(undefined1 *)((long)local_58 + 0x30) & 2) == 0) {
    bVar2 = (((anon_union_24_2_63b86169_for_instance_1 *)((long)local_58 + 0x10))->nonsimple).status
            [(long)&((v_h.inst)->ob_base).ob_refcnt] & 2;
  }
  else {
    bVar2 = *(undefined1 *)((long)local_58 + 0x30) & 8;
  }
  if (bVar2 == 0) {
    valueptr = (v_h.type)->type;
    local_60 = inst;
    v_h.vh = (void **)valueptr;
    piVar3 = detail::get_internals();
    std::
    _Hashtable<void_const*,std::pair<void_const*const,pybind11::detail::instance*>,std::allocator<std::pair<void_const*const,pybind11::detail::instance*>>,std::__detail::_Select1st,std::equal_to<void_const*>,std::hash<void_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,false>>
    ::_M_emplace<void*&,pybind11::detail::instance*&>
              ((_Hashtable<void_const*,std::pair<void_const*const,pybind11::detail::instance*>,std::allocator<std::pair<void_const*const,pybind11::detail::instance*>>,std::__detail::_Select1st,std::equal_to<void_const*>,std::hash<void_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,false>>
                *)&piVar3->registered_instances,0,&v_h.vh,&local_60);
    if ((*(byte *)(v_h.index + 0x90) & 2) == 0) {
      detail::traverse_offset_bases
                (valueptr,(type_info *)v_h.index,inst,detail::register_instance_impl);
    }
    if ((*(undefined1 *)((long)local_58 + 0x30) & 2) == 0) {
      pbVar1 = (((anon_union_24_2_63b86169_for_instance_1 *)((long)local_58 + 0x10))->nonsimple).
               status + (long)&((v_h.inst)->ob_base).ob_refcnt;
      *pbVar1 = *pbVar1 | 2;
    }
    else {
      *(byte *)((long)local_58 + 0x30) = *(undefined1 *)((long)local_58 + 0x30) | 8;
    }
  }
  init_holder(inst,(value_and_holder *)local_58,(holder_type *)holder_ptr,(v_h.type)->type);
  return;
}

Assistant:

static void init_instance(detail::instance *inst, const void *holder_ptr) {
        auto v_h = inst->get_value_and_holder(detail::get_type_info(typeid(type)));
        if (!v_h.instance_registered()) {
            register_instance(inst, v_h.value_ptr(), v_h.type);
            v_h.set_instance_registered();
        }
        init_holder(inst, v_h, (const holder_type *) holder_ptr, v_h.value_ptr<type>());
    }